

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O0

void jit_trace_dump(Trace *trace)

{
  char *pcVar1;
  IrRef IVar2;
  IrRef IVar3;
  IrIns *pIVar4;
  IrIns IVar5;
  IrIns *ins;
  int i;
  Trace *trace_local;
  
  printf("---- Trace ----\n");
  for (ins._4_4_ = 1; (int)ins._4_4_ < trace->ir_count; ins._4_4_ = ins._4_4_ + 1) {
    pIVar4 = trace->ir + (int)ins._4_4_;
    IVar5 = ir_op(*pIVar4);
    pcVar1 = IROP_NAMES[IVar5];
    IVar2 = ir_arg1(*pIVar4);
    IVar3 = ir_arg2(*pIVar4);
    printf("  %0.4d  %s  %d  %d\n",(ulong)ins._4_4_,pcVar1,(ulong)IVar2,(ulong)IVar3);
  }
  return;
}

Assistant:

void jit_trace_dump(Trace *trace) {
	printf("---- Trace ----\n");
	for (int i = 1; i < trace->ir_count; i++) {
		IrIns *ins = &trace->ir[i];
		printf("  %0.4d  %s  %d  %d\n", i, IROP_NAMES[ir_op(*ins)], 
			ir_arg1(*ins), ir_arg2(*ins));
	}
}